

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-arithm.cpp
# Opt level: O3

void test_arithm<int>(uint length,int value1,int value2,bool allowTrash)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  ulong uVar31;
  int iVar32;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var33;
  long lVar34;
  ulong uVar35;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var36;
  undefined8 *puVar37;
  uint uVar38;
  uint uVar39;
  undefined7 in_register_00000009;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var40;
  uint uVar41;
  long lVar42;
  ulong uVar43;
  uint uVar44;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> _Var45;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> _Var46;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> _Var47;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> _Var48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> _Var49;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_88;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_80;
  shared_ptr<int> pv1;
  shared_ptr<int> pv2;
  shared_ptr<int> presult;
  
  presult.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       (undefined4)CONCAT71(in_register_00000009,allowTrash);
  lVar42 = (long)(int)length;
  iVar32 = posix_memalign(&pv1.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                          ,0x40,lVar42 * 4);
  local_80 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (iVar32 == 0) {
    local_80 = pv1.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<int*,void(*)(int*),std::allocator<void>,void>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pv1,local_80,sse::common::free<int>);
  iVar32 = posix_memalign(&pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                          ,0x40,lVar42 * 4);
  pv1.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (iVar32 == 0) {
    pv1.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount =
         pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<int*,void(*)(int*),std::allocator<void>,void>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pv2,
             pv1.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
             sse::common::free<int>);
  iVar32 = posix_memalign(&local_88,0x40,(long)(int)(length + 1) << 2);
  if (iVar32 != 0) {
    local_88 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = local_88;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<int*,void(*)(int*),std::allocator<void>,void>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&presult,local_88,sse::common::free<int>)
  ;
  uVar31 = (ulong)length;
  *(undefined4 *)
   ((long)&(pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
           _vptr__Sp_counted_base + uVar31 * 4) = 0x7f;
  uVar44 = (int)length >> 2;
  p_Var33 = local_80;
  uVar38 = uVar44;
  uVar39 = uVar44;
  if (3 < (int)uVar44) {
    do {
      *(int *)&p_Var33->_vptr__Sp_counted_base = value1;
      *(int *)((long)&p_Var33->_vptr__Sp_counted_base + 4) = value1;
      p_Var33->_M_use_count = value1;
      p_Var33->_M_weak_count = value1;
      *(int *)&p_Var33[1]._vptr__Sp_counted_base = value1;
      *(int *)((long)&p_Var33[1]._vptr__Sp_counted_base + 4) = value1;
      p_Var33[1]._M_use_count = value1;
      p_Var33[1]._M_weak_count = value1;
      *(int *)&p_Var33[2]._vptr__Sp_counted_base = value1;
      *(int *)((long)&p_Var33[2]._vptr__Sp_counted_base + 4) = value1;
      p_Var33[2]._M_use_count = value1;
      p_Var33[2]._M_weak_count = value1;
      *(int *)&p_Var33[3]._vptr__Sp_counted_base = value1;
      *(int *)((long)&p_Var33[3]._vptr__Sp_counted_base + 4) = value1;
      p_Var33[3]._M_use_count = value1;
      p_Var33[3]._M_weak_count = value1;
      uVar38 = uVar39 - 4;
      p_Var33 = p_Var33 + 4;
      bVar2 = 7 < uVar39;
      uVar39 = uVar38;
    } while (bVar2);
  }
  if (1 < (int)uVar38) {
    *(int *)&p_Var33->_vptr__Sp_counted_base = value1;
    *(int *)((long)&p_Var33->_vptr__Sp_counted_base + 4) = value1;
    p_Var33->_M_use_count = value1;
    p_Var33->_M_weak_count = value1;
    *(int *)&p_Var33[1]._vptr__Sp_counted_base = value1;
    *(int *)((long)&p_Var33[1]._vptr__Sp_counted_base + 4) = value1;
    p_Var33[1]._M_use_count = value1;
    p_Var33[1]._M_weak_count = value1;
    uVar38 = uVar38 - 2;
    p_Var33 = p_Var33 + 2;
  }
  if (uVar38 != 0) {
    *(int *)&p_Var33->_vptr__Sp_counted_base = value1;
    *(int *)((long)&p_Var33->_vptr__Sp_counted_base + 4) = value1;
    p_Var33->_M_use_count = value1;
    p_Var33->_M_weak_count = value1;
  }
  uVar38 = length & 0xfffffffc;
  if (uVar38 != length) {
    lVar34 = (long)(int)uVar38;
    do {
      *(int *)((long)&local_80->_vptr__Sp_counted_base + lVar34 * 4) = value1;
      lVar34 = lVar34 + 1;
    } while (lVar34 < lVar42);
  }
  _Var45._vptr__Sp_counted_base._4_4_ = value2;
  _Var45._vptr__Sp_counted_base._0_4_ = value2;
  _Var45._M_use_count = value2;
  _Var45._M_weak_count = value2;
  _Var36 = pv1.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  uVar41 = uVar44;
  uVar39 = uVar44;
  if (3 < (int)uVar44) {
    do {
      *_Var36._M_pi = _Var45;
      _Var36._M_pi[1] = _Var45;
      _Var36._M_pi[2] = _Var45;
      _Var36._M_pi[3] = _Var45;
      uVar39 = uVar41 - 4;
      _Var36._M_pi = _Var36._M_pi + 4;
      bVar2 = 7 < uVar41;
      uVar41 = uVar39;
    } while (bVar2);
  }
  if (1 < (int)uVar39) {
    *_Var36._M_pi = _Var45;
    _Var36._M_pi[1] = _Var45;
    uVar39 = uVar39 - 2;
    _Var36._M_pi = _Var36._M_pi + 2;
  }
  if (uVar39 != 0) {
    *_Var36._M_pi = _Var45;
  }
  if (uVar38 != length) {
    lVar34 = (long)(int)uVar38;
    do {
      *(int *)((long)&(pv1.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                      _vptr__Sp_counted_base + lVar34 * 4) = value2;
      lVar34 = lVar34 + 1;
    } while (lVar34 < lVar42);
  }
  if (length != 0) {
    uVar35 = 0;
    do {
      if ((*(int *)((long)&local_80->_vptr__Sp_counted_base + uVar35 * 4) != value1) ||
         (*(int *)((long)&(pv1.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                          )->_vptr__Sp_counted_base + uVar35 * 4) != value2)) {
        puVar37 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar37 = "void test_arithm(unsigned int, T, T, bool) [T = int]";
        *(undefined4 *)(puVar37 + 1) = 0x1a;
        *(uint *)((long)puVar37 + 0xc) = length;
        __cxa_throw(puVar37,&Exception::typeinfo,0);
      }
      uVar35 = uVar35 + 1;
    } while (uVar31 != uVar35);
    _Var36._M_pi = pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    p_Var33 = local_80;
    _Var40 = pv1.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    uVar39 = uVar44;
    uVar41 = uVar44;
    if (3 < (int)uVar44) {
      do {
        iVar32 = *(int *)((long)&(_Var40._M_pi)->_vptr__Sp_counted_base + 4);
        iVar1 = (_Var40._M_pi)->_M_use_count;
        iVar3 = (_Var40._M_pi)->_M_weak_count;
        iVar4 = *(int *)&_Var40._M_pi[1]._vptr__Sp_counted_base;
        iVar5 = *(int *)((long)&_Var40._M_pi[1]._vptr__Sp_counted_base + 4);
        iVar6 = _Var40._M_pi[1]._M_use_count;
        iVar7 = _Var40._M_pi[1]._M_weak_count;
        iVar8 = *(int *)&_Var40._M_pi[2]._vptr__Sp_counted_base;
        iVar9 = *(int *)((long)&_Var40._M_pi[2]._vptr__Sp_counted_base + 4);
        iVar10 = _Var40._M_pi[2]._M_use_count;
        iVar11 = _Var40._M_pi[2]._M_weak_count;
        iVar12 = *(int *)&_Var40._M_pi[3]._vptr__Sp_counted_base;
        iVar13 = *(int *)((long)&_Var40._M_pi[3]._vptr__Sp_counted_base + 4);
        iVar14 = _Var40._M_pi[3]._M_use_count;
        iVar15 = _Var40._M_pi[3]._M_weak_count;
        iVar16 = *(int *)((long)&p_Var33->_vptr__Sp_counted_base + 4);
        iVar17 = p_Var33->_M_use_count;
        iVar18 = p_Var33->_M_weak_count;
        iVar19 = *(int *)&p_Var33[1]._vptr__Sp_counted_base;
        iVar20 = *(int *)((long)&p_Var33[1]._vptr__Sp_counted_base + 4);
        iVar21 = p_Var33[1]._M_use_count;
        iVar22 = p_Var33[1]._M_weak_count;
        iVar23 = *(int *)&p_Var33[2]._vptr__Sp_counted_base;
        iVar24 = *(int *)((long)&p_Var33[2]._vptr__Sp_counted_base + 4);
        iVar25 = p_Var33[2]._M_use_count;
        iVar26 = p_Var33[2]._M_weak_count;
        iVar27 = *(int *)&p_Var33[3]._vptr__Sp_counted_base;
        iVar28 = *(int *)((long)&p_Var33[3]._vptr__Sp_counted_base + 4);
        iVar29 = p_Var33[3]._M_use_count;
        iVar30 = p_Var33[3]._M_weak_count;
        *(int *)&(_Var36._M_pi)->_vptr__Sp_counted_base =
             *(int *)&(_Var40._M_pi)->_vptr__Sp_counted_base +
             *(int *)&p_Var33->_vptr__Sp_counted_base;
        *(int *)((long)&(_Var36._M_pi)->_vptr__Sp_counted_base + 4) = iVar32 + iVar16;
        (_Var36._M_pi)->_M_use_count = iVar1 + iVar17;
        (_Var36._M_pi)->_M_weak_count = iVar3 + iVar18;
        *(int *)&_Var36._M_pi[1]._vptr__Sp_counted_base = iVar4 + iVar19;
        *(int *)((long)&_Var36._M_pi[1]._vptr__Sp_counted_base + 4) = iVar5 + iVar20;
        _Var36._M_pi[1]._M_use_count = iVar6 + iVar21;
        _Var36._M_pi[1]._M_weak_count = iVar7 + iVar22;
        *(int *)&_Var36._M_pi[2]._vptr__Sp_counted_base = iVar8 + iVar23;
        *(int *)((long)&_Var36._M_pi[2]._vptr__Sp_counted_base + 4) = iVar9 + iVar24;
        _Var36._M_pi[2]._M_use_count = iVar10 + iVar25;
        _Var36._M_pi[2]._M_weak_count = iVar11 + iVar26;
        *(int *)&_Var36._M_pi[3]._vptr__Sp_counted_base = iVar12 + iVar27;
        *(int *)((long)&_Var36._M_pi[3]._vptr__Sp_counted_base + 4) = iVar13 + iVar28;
        _Var36._M_pi[3]._M_use_count = iVar14 + iVar29;
        _Var36._M_pi[3]._M_weak_count = iVar15 + iVar30;
        uVar39 = uVar41 - 4;
        p_Var33 = p_Var33 + 4;
        _Var40._M_pi = _Var40._M_pi + 4;
        _Var36._M_pi = _Var36._M_pi + 4;
        bVar2 = 7 < uVar41;
        uVar41 = uVar39;
      } while (bVar2);
    }
    if (1 < (int)uVar39) {
      iVar32 = *(int *)((long)&(_Var40._M_pi)->_vptr__Sp_counted_base + 4);
      iVar1 = (_Var40._M_pi)->_M_use_count;
      iVar3 = (_Var40._M_pi)->_M_weak_count;
      iVar4 = *(int *)((long)&p_Var33->_vptr__Sp_counted_base + 4);
      iVar5 = p_Var33->_M_use_count;
      iVar6 = p_Var33->_M_weak_count;
      *(int *)&(_Var36._M_pi)->_vptr__Sp_counted_base =
           *(int *)&(_Var40._M_pi)->_vptr__Sp_counted_base +
           *(int *)&p_Var33->_vptr__Sp_counted_base;
      *(int *)((long)&(_Var36._M_pi)->_vptr__Sp_counted_base + 4) = iVar32 + iVar4;
      (_Var36._M_pi)->_M_use_count = iVar1 + iVar5;
      (_Var36._M_pi)->_M_weak_count = iVar3 + iVar6;
      iVar32 = *(int *)((long)&_Var40._M_pi[1]._vptr__Sp_counted_base + 4);
      iVar1 = _Var40._M_pi[1]._M_use_count;
      iVar3 = _Var40._M_pi[1]._M_weak_count;
      iVar4 = *(int *)((long)&p_Var33[1]._vptr__Sp_counted_base + 4);
      iVar5 = p_Var33[1]._M_use_count;
      iVar6 = p_Var33[1]._M_weak_count;
      *(int *)&_Var36._M_pi[1]._vptr__Sp_counted_base =
           *(int *)&_Var40._M_pi[1]._vptr__Sp_counted_base +
           *(int *)&p_Var33[1]._vptr__Sp_counted_base;
      *(int *)((long)&_Var36._M_pi[1]._vptr__Sp_counted_base + 4) = iVar32 + iVar4;
      _Var36._M_pi[1]._M_use_count = iVar1 + iVar5;
      _Var36._M_pi[1]._M_weak_count = iVar3 + iVar6;
      uVar39 = uVar39 - 2;
      p_Var33 = p_Var33 + 2;
      _Var40._M_pi = _Var40._M_pi + 2;
      _Var36._M_pi = _Var36._M_pi + 2;
    }
    if (uVar39 != 0) {
      iVar32 = *(int *)((long)&(_Var40._M_pi)->_vptr__Sp_counted_base + 4);
      iVar1 = (_Var40._M_pi)->_M_use_count;
      iVar3 = (_Var40._M_pi)->_M_weak_count;
      iVar4 = *(int *)((long)&p_Var33->_vptr__Sp_counted_base + 4);
      iVar5 = p_Var33->_M_use_count;
      iVar6 = p_Var33->_M_weak_count;
      *(int *)&(_Var36._M_pi)->_vptr__Sp_counted_base =
           *(int *)&(_Var40._M_pi)->_vptr__Sp_counted_base +
           *(int *)&p_Var33->_vptr__Sp_counted_base;
      *(int *)((long)&(_Var36._M_pi)->_vptr__Sp_counted_base + 4) = iVar32 + iVar4;
      (_Var36._M_pi)->_M_use_count = iVar1 + iVar5;
      (_Var36._M_pi)->_M_weak_count = iVar3 + iVar6;
    }
  }
  if (uVar38 != length) {
    lVar34 = (long)(int)uVar38;
    do {
      *(int *)((long)&(pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                      _vptr__Sp_counted_base + lVar34 * 4) =
           *(int *)((long)&(pv1.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi)->_vptr__Sp_counted_base + lVar34 * 4) +
           *(int *)((long)&local_80->_vptr__Sp_counted_base + lVar34 * 4);
      lVar34 = lVar34 + 1;
    } while (lVar34 < lVar42);
  }
  if (length != 0) {
    uVar35 = 0;
    do {
      if (*(int *)((long)&(pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                          )->_vptr__Sp_counted_base + uVar35 * 4) != value1 + value2) {
        puVar37 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar37 = "void test_arithm(unsigned int, T, T, bool) [T = int]";
        *(undefined4 *)(puVar37 + 1) = 0x22;
        *(uint *)((long)puVar37 + 0xc) = length;
        __cxa_throw(puVar37,&Exception::typeinfo,0);
      }
      uVar35 = uVar35 + 1;
    } while (uVar31 != uVar35);
    _Var36._M_pi = pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    _Var40 = pv1.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    p_Var33 = local_80;
    uVar39 = uVar44;
    uVar41 = uVar44;
    if (3 < (int)uVar44) {
      do {
        iVar32 = *(int *)((long)&p_Var33->_vptr__Sp_counted_base + 4);
        iVar1 = p_Var33->_M_use_count;
        iVar3 = p_Var33->_M_weak_count;
        iVar4 = *(int *)&p_Var33[1]._vptr__Sp_counted_base;
        iVar5 = *(int *)((long)&p_Var33[1]._vptr__Sp_counted_base + 4);
        iVar6 = p_Var33[1]._M_use_count;
        iVar7 = p_Var33[1]._M_weak_count;
        iVar8 = *(int *)&p_Var33[2]._vptr__Sp_counted_base;
        iVar9 = *(int *)((long)&p_Var33[2]._vptr__Sp_counted_base + 4);
        iVar10 = p_Var33[2]._M_use_count;
        iVar11 = p_Var33[2]._M_weak_count;
        iVar12 = *(int *)&p_Var33[3]._vptr__Sp_counted_base;
        iVar13 = *(int *)((long)&p_Var33[3]._vptr__Sp_counted_base + 4);
        iVar14 = p_Var33[3]._M_use_count;
        iVar15 = p_Var33[3]._M_weak_count;
        iVar16 = *(int *)((long)&(_Var40._M_pi)->_vptr__Sp_counted_base + 4);
        iVar17 = (_Var40._M_pi)->_M_use_count;
        iVar18 = (_Var40._M_pi)->_M_weak_count;
        iVar19 = *(int *)&_Var40._M_pi[1]._vptr__Sp_counted_base;
        iVar20 = *(int *)((long)&_Var40._M_pi[1]._vptr__Sp_counted_base + 4);
        iVar21 = _Var40._M_pi[1]._M_use_count;
        iVar22 = _Var40._M_pi[1]._M_weak_count;
        iVar23 = *(int *)&_Var40._M_pi[2]._vptr__Sp_counted_base;
        iVar24 = *(int *)((long)&_Var40._M_pi[2]._vptr__Sp_counted_base + 4);
        iVar25 = _Var40._M_pi[2]._M_use_count;
        iVar26 = _Var40._M_pi[2]._M_weak_count;
        iVar27 = *(int *)&_Var40._M_pi[3]._vptr__Sp_counted_base;
        iVar28 = *(int *)((long)&_Var40._M_pi[3]._vptr__Sp_counted_base + 4);
        iVar29 = _Var40._M_pi[3]._M_use_count;
        iVar30 = _Var40._M_pi[3]._M_weak_count;
        *(int *)&(_Var36._M_pi)->_vptr__Sp_counted_base =
             *(int *)&p_Var33->_vptr__Sp_counted_base -
             *(int *)&(_Var40._M_pi)->_vptr__Sp_counted_base;
        *(int *)((long)&(_Var36._M_pi)->_vptr__Sp_counted_base + 4) = iVar32 - iVar16;
        (_Var36._M_pi)->_M_use_count = iVar1 - iVar17;
        (_Var36._M_pi)->_M_weak_count = iVar3 - iVar18;
        *(int *)&_Var36._M_pi[1]._vptr__Sp_counted_base = iVar4 - iVar19;
        *(int *)((long)&_Var36._M_pi[1]._vptr__Sp_counted_base + 4) = iVar5 - iVar20;
        _Var36._M_pi[1]._M_use_count = iVar6 - iVar21;
        _Var36._M_pi[1]._M_weak_count = iVar7 - iVar22;
        *(int *)&_Var36._M_pi[2]._vptr__Sp_counted_base = iVar8 - iVar23;
        *(int *)((long)&_Var36._M_pi[2]._vptr__Sp_counted_base + 4) = iVar9 - iVar24;
        _Var36._M_pi[2]._M_use_count = iVar10 - iVar25;
        _Var36._M_pi[2]._M_weak_count = iVar11 - iVar26;
        *(int *)&_Var36._M_pi[3]._vptr__Sp_counted_base = iVar12 - iVar27;
        *(int *)((long)&_Var36._M_pi[3]._vptr__Sp_counted_base + 4) = iVar13 - iVar28;
        _Var36._M_pi[3]._M_use_count = iVar14 - iVar29;
        _Var36._M_pi[3]._M_weak_count = iVar15 - iVar30;
        uVar39 = uVar41 - 4;
        p_Var33 = p_Var33 + 4;
        _Var40._M_pi = _Var40._M_pi + 4;
        _Var36._M_pi = _Var36._M_pi + 4;
        bVar2 = 7 < uVar41;
        uVar41 = uVar39;
      } while (bVar2);
    }
    if (1 < (int)uVar39) {
      iVar32 = *(int *)((long)&p_Var33->_vptr__Sp_counted_base + 4);
      iVar1 = p_Var33->_M_use_count;
      iVar3 = p_Var33->_M_weak_count;
      iVar4 = *(int *)((long)&(_Var40._M_pi)->_vptr__Sp_counted_base + 4);
      iVar5 = (_Var40._M_pi)->_M_use_count;
      iVar6 = (_Var40._M_pi)->_M_weak_count;
      *(int *)&(_Var36._M_pi)->_vptr__Sp_counted_base =
           *(int *)&p_Var33->_vptr__Sp_counted_base -
           *(int *)&(_Var40._M_pi)->_vptr__Sp_counted_base;
      *(int *)((long)&(_Var36._M_pi)->_vptr__Sp_counted_base + 4) = iVar32 - iVar4;
      (_Var36._M_pi)->_M_use_count = iVar1 - iVar5;
      (_Var36._M_pi)->_M_weak_count = iVar3 - iVar6;
      iVar32 = *(int *)((long)&p_Var33[1]._vptr__Sp_counted_base + 4);
      iVar1 = p_Var33[1]._M_use_count;
      iVar3 = p_Var33[1]._M_weak_count;
      iVar4 = *(int *)((long)&_Var40._M_pi[1]._vptr__Sp_counted_base + 4);
      iVar5 = _Var40._M_pi[1]._M_use_count;
      iVar6 = _Var40._M_pi[1]._M_weak_count;
      *(int *)&_Var36._M_pi[1]._vptr__Sp_counted_base =
           *(int *)&p_Var33[1]._vptr__Sp_counted_base -
           *(int *)&_Var40._M_pi[1]._vptr__Sp_counted_base;
      *(int *)((long)&_Var36._M_pi[1]._vptr__Sp_counted_base + 4) = iVar32 - iVar4;
      _Var36._M_pi[1]._M_use_count = iVar1 - iVar5;
      _Var36._M_pi[1]._M_weak_count = iVar3 - iVar6;
      uVar39 = uVar39 - 2;
      p_Var33 = p_Var33 + 2;
      _Var40._M_pi = _Var40._M_pi + 2;
      _Var36._M_pi = _Var36._M_pi + 2;
    }
    if (uVar39 != 0) {
      iVar32 = *(int *)((long)&p_Var33->_vptr__Sp_counted_base + 4);
      iVar1 = p_Var33->_M_use_count;
      iVar3 = p_Var33->_M_weak_count;
      iVar4 = *(int *)((long)&(_Var40._M_pi)->_vptr__Sp_counted_base + 4);
      iVar5 = (_Var40._M_pi)->_M_use_count;
      iVar6 = (_Var40._M_pi)->_M_weak_count;
      *(int *)&(_Var36._M_pi)->_vptr__Sp_counted_base =
           *(int *)&p_Var33->_vptr__Sp_counted_base -
           *(int *)&(_Var40._M_pi)->_vptr__Sp_counted_base;
      *(int *)((long)&(_Var36._M_pi)->_vptr__Sp_counted_base + 4) = iVar32 - iVar4;
      (_Var36._M_pi)->_M_use_count = iVar1 - iVar5;
      (_Var36._M_pi)->_M_weak_count = iVar3 - iVar6;
    }
  }
  if (uVar38 != length) {
    lVar34 = (long)(int)uVar38;
    do {
      *(int *)((long)&(pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                      _vptr__Sp_counted_base + lVar34 * 4) =
           *(int *)((long)&local_80->_vptr__Sp_counted_base + lVar34 * 4) -
           *(int *)((long)&(pv1.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi)->_vptr__Sp_counted_base + lVar34 * 4);
      lVar34 = lVar34 + 1;
    } while (lVar34 < lVar42);
  }
  if (length != 0) {
    uVar35 = 0;
    do {
      if (*(int *)((long)&(pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                          )->_vptr__Sp_counted_base + uVar35 * 4) != value1 - value2) {
        puVar37 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar37 = "void test_arithm(unsigned int, T, T, bool) [T = int]";
        *(undefined4 *)(puVar37 + 1) = 0x2a;
        *(uint *)((long)puVar37 + 0xc) = length;
        __cxa_throw(puVar37,&Exception::typeinfo,0);
      }
      uVar35 = uVar35 + 1;
    } while (uVar31 != uVar35);
    _Var36._M_pi = pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    p_Var33 = local_80;
    _Var40 = pv1.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    uVar39 = uVar44;
    uVar41 = uVar44;
    if (3 < (int)uVar44) {
      do {
        _Var46 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)
                 pmulld((undefined1  [16])*_Var40._M_pi,(undefined1  [16])*p_Var33);
        _Var47 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)
                 pmulld((undefined1  [16])_Var40._M_pi[1],(undefined1  [16])p_Var33[1]);
        _Var48 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)
                 pmulld((undefined1  [16])_Var40._M_pi[2],(undefined1  [16])p_Var33[2]);
        _Var49 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)
                 pmulld((undefined1  [16])_Var40._M_pi[3],(undefined1  [16])p_Var33[3]);
        *_Var36._M_pi = _Var46;
        _Var36._M_pi[1] = _Var47;
        _Var36._M_pi[2] = _Var48;
        _Var36._M_pi[3] = _Var49;
        uVar39 = uVar41 - 4;
        p_Var33 = p_Var33 + 4;
        _Var40._M_pi = _Var40._M_pi + 4;
        _Var36._M_pi = _Var36._M_pi + 4;
        bVar2 = 7 < uVar41;
        uVar41 = uVar39;
      } while (bVar2);
    }
    if (1 < (int)uVar39) {
      _Var46 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)
               pmulld((undefined1  [16])*_Var40._M_pi,(undefined1  [16])*p_Var33);
      *_Var36._M_pi = _Var46;
      _Var46 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)
               pmulld((undefined1  [16])_Var40._M_pi[1],(undefined1  [16])p_Var33[1]);
      _Var36._M_pi[1] = _Var46;
      uVar39 = uVar39 - 2;
      p_Var33 = p_Var33 + 2;
      _Var40._M_pi = _Var40._M_pi + 2;
      _Var36._M_pi = _Var36._M_pi + 2;
    }
    if (uVar39 != 0) {
      _Var46 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)
               pmulld((undefined1  [16])*_Var40._M_pi,(undefined1  [16])*p_Var33);
      *_Var36._M_pi = _Var46;
    }
  }
  if (uVar38 != length) {
    lVar34 = (long)(int)uVar38;
    do {
      *(int *)((long)&(pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                      _vptr__Sp_counted_base + lVar34 * 4) =
           *(int *)((long)&(pv1.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi)->_vptr__Sp_counted_base + lVar34 * 4) *
           *(int *)((long)&local_80->_vptr__Sp_counted_base + lVar34 * 4);
      lVar34 = lVar34 + 1;
    } while (lVar34 < lVar42);
  }
  if (length != 0) {
    uVar35 = 0;
    do {
      if (*(int *)((long)&(pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                          )->_vptr__Sp_counted_base + uVar35 * 4) != value2 * value1) {
        puVar37 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar37 = "void test_arithm(unsigned int, T, T, bool) [T = int]";
        *(undefined4 *)(puVar37 + 1) = 0x32;
        *(uint *)((long)puVar37 + 0xc) = length;
        __cxa_throw(puVar37,&Exception::typeinfo,0);
      }
      uVar35 = uVar35 + 1;
    } while (uVar31 != uVar35);
  }
  p_Var33 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            ((long)value1 % (long)value2 & 0xffffffff);
  if (local_80 == pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi) {
    if (0 < (int)length) {
      uVar35 = 0;
      do {
        iVar32 = *(int *)((long)&(pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount._M_pi)->_vptr__Sp_counted_base + uVar35 * 4);
        iVar1 = *(int *)((long)&(pv1.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                                ._M_pi)->_vptr__Sp_counted_base + uVar35 * 4);
        p_Var33 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  ((long)iVar32 % (long)iVar1 & 0xffffffff);
        *(int *)((long)&(pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
                        ->_vptr__Sp_counted_base + uVar35 * 4) = iVar32 / iVar1;
        uVar35 = uVar35 + 1;
      } while (uVar31 != uVar35);
    }
  }
  else if (0 < (int)length) {
    uVar35 = 0;
    do {
      iVar32 = *(int *)((long)&local_80->_vptr__Sp_counted_base + uVar35 * 4);
      iVar1 = *(int *)((long)&(pv1.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                              _M_pi)->_vptr__Sp_counted_base + uVar35 * 4);
      p_Var33 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                ((long)iVar32 % (long)iVar1 & 0xffffffff);
      *(int *)((long)&(pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                      _vptr__Sp_counted_base + uVar35 * 4) = iVar32 / iVar1;
      uVar35 = uVar35 + 1;
    } while (uVar31 != uVar35);
  }
  if (length != 0) {
    uVar35 = 0;
    do {
      if (*(int *)((long)&(pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                          )->_vptr__Sp_counted_base + uVar35 * 4) != value1 / value2) {
        puVar37 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar37 = "void test_arithm(unsigned int, T, T, bool) [T = int]";
        *(undefined4 *)(puVar37 + 1) = 0x3a;
        *(uint *)((long)puVar37 + 0xc) = length;
        __cxa_throw(puVar37,&Exception::typeinfo,0);
      }
      uVar35 = uVar35 + 1;
    } while (uVar31 != uVar35);
    _Var36._M_pi = pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    p_Var33 = local_80;
    uVar39 = uVar44;
    uVar41 = uVar44;
    if (3 < (int)uVar44) {
      do {
        iVar32 = *(int *)((long)&p_Var33->_vptr__Sp_counted_base + 4);
        iVar1 = p_Var33->_M_use_count;
        iVar3 = p_Var33->_M_weak_count;
        *(int *)&(_Var36._M_pi)->_vptr__Sp_counted_base =
             *(int *)&p_Var33->_vptr__Sp_counted_base + value2;
        *(int *)((long)&(_Var36._M_pi)->_vptr__Sp_counted_base + 4) = iVar32 + value2;
        (_Var36._M_pi)->_M_use_count = iVar1 + value2;
        (_Var36._M_pi)->_M_weak_count = iVar3 + value2;
        iVar32 = *(int *)((long)&p_Var33[1]._vptr__Sp_counted_base + 4);
        iVar1 = p_Var33[1]._M_use_count;
        iVar3 = p_Var33[1]._M_weak_count;
        *(int *)&_Var36._M_pi[1]._vptr__Sp_counted_base =
             *(int *)&p_Var33[1]._vptr__Sp_counted_base + value2;
        *(int *)((long)&_Var36._M_pi[1]._vptr__Sp_counted_base + 4) = iVar32 + value2;
        _Var36._M_pi[1]._M_use_count = iVar1 + value2;
        _Var36._M_pi[1]._M_weak_count = iVar3 + value2;
        iVar32 = *(int *)((long)&p_Var33[2]._vptr__Sp_counted_base + 4);
        iVar1 = p_Var33[2]._M_use_count;
        iVar3 = p_Var33[2]._M_weak_count;
        *(int *)&_Var36._M_pi[2]._vptr__Sp_counted_base =
             *(int *)&p_Var33[2]._vptr__Sp_counted_base + value2;
        *(int *)((long)&_Var36._M_pi[2]._vptr__Sp_counted_base + 4) = iVar32 + value2;
        _Var36._M_pi[2]._M_use_count = iVar1 + value2;
        _Var36._M_pi[2]._M_weak_count = iVar3 + value2;
        iVar32 = *(int *)((long)&p_Var33[3]._vptr__Sp_counted_base + 4);
        iVar1 = p_Var33[3]._M_use_count;
        iVar3 = p_Var33[3]._M_weak_count;
        *(int *)&_Var36._M_pi[3]._vptr__Sp_counted_base =
             *(int *)&p_Var33[3]._vptr__Sp_counted_base + value2;
        *(int *)((long)&_Var36._M_pi[3]._vptr__Sp_counted_base + 4) = iVar32 + value2;
        _Var36._M_pi[3]._M_use_count = iVar1 + value2;
        _Var36._M_pi[3]._M_weak_count = iVar3 + value2;
        uVar39 = uVar41 - 4;
        p_Var33 = p_Var33 + 4;
        _Var36._M_pi = _Var36._M_pi + 4;
        bVar2 = 7 < uVar41;
        uVar41 = uVar39;
      } while (bVar2);
    }
    if (1 < (int)uVar39) {
      iVar32 = *(int *)((long)&p_Var33->_vptr__Sp_counted_base + 4);
      iVar1 = p_Var33->_M_use_count;
      iVar3 = p_Var33->_M_weak_count;
      *(int *)&(_Var36._M_pi)->_vptr__Sp_counted_base =
           *(int *)&p_Var33->_vptr__Sp_counted_base + value2;
      *(int *)((long)&(_Var36._M_pi)->_vptr__Sp_counted_base + 4) = iVar32 + value2;
      (_Var36._M_pi)->_M_use_count = iVar1 + value2;
      (_Var36._M_pi)->_M_weak_count = iVar3 + value2;
      iVar32 = *(int *)((long)&p_Var33[1]._vptr__Sp_counted_base + 4);
      iVar1 = p_Var33[1]._M_use_count;
      iVar3 = p_Var33[1]._M_weak_count;
      *(int *)&_Var36._M_pi[1]._vptr__Sp_counted_base =
           *(int *)&p_Var33[1]._vptr__Sp_counted_base + value2;
      *(int *)((long)&_Var36._M_pi[1]._vptr__Sp_counted_base + 4) = iVar32 + value2;
      _Var36._M_pi[1]._M_use_count = iVar1 + value2;
      _Var36._M_pi[1]._M_weak_count = iVar3 + value2;
      uVar39 = uVar39 - 2;
      p_Var33 = p_Var33 + 2;
      _Var36._M_pi = _Var36._M_pi + 2;
    }
    if (uVar39 != 0) {
      iVar32 = *(int *)((long)&p_Var33->_vptr__Sp_counted_base + 4);
      iVar1 = p_Var33->_M_use_count;
      iVar3 = p_Var33->_M_weak_count;
      *(int *)&(_Var36._M_pi)->_vptr__Sp_counted_base =
           *(int *)&p_Var33->_vptr__Sp_counted_base + value2;
      *(int *)((long)&(_Var36._M_pi)->_vptr__Sp_counted_base + 4) = iVar32 + value2;
      (_Var36._M_pi)->_M_use_count = iVar1 + value2;
      (_Var36._M_pi)->_M_weak_count = iVar3 + value2;
    }
  }
  if (uVar38 != length) {
    lVar34 = (long)(int)uVar38;
    do {
      uVar39 = *(int *)((long)&local_80->_vptr__Sp_counted_base + lVar34 * 4) + value2;
      p_Var33 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(ulong)uVar39;
      *(uint *)((long)&(pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                       _vptr__Sp_counted_base + lVar34 * 4) = uVar39;
      lVar34 = lVar34 + 1;
    } while (lVar34 < lVar42);
  }
  if (length != 0) {
    uVar35 = 0;
    do {
      if (*(int *)((long)&(pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                          )->_vptr__Sp_counted_base + uVar35 * 4) != value1 + value2) {
        puVar37 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar37 = "void test_arithm(unsigned int, T, T, bool) [T = int]";
        *(undefined4 *)(puVar37 + 1) = 0x43;
        *(uint *)((long)puVar37 + 0xc) = length;
        __cxa_throw(puVar37,&Exception::typeinfo,0);
      }
      uVar35 = uVar35 + 1;
    } while (uVar31 != uVar35);
    _Var36._M_pi = pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    p_Var33 = local_80;
    uVar39 = uVar44;
    uVar41 = uVar44;
    if (3 < (int)uVar44) {
      do {
        iVar32 = *(int *)((long)&p_Var33->_vptr__Sp_counted_base + 4);
        iVar1 = p_Var33->_M_use_count;
        iVar3 = p_Var33->_M_weak_count;
        *(int *)&(_Var36._M_pi)->_vptr__Sp_counted_base =
             *(int *)&p_Var33->_vptr__Sp_counted_base - value2;
        *(int *)((long)&(_Var36._M_pi)->_vptr__Sp_counted_base + 4) = iVar32 - value2;
        (_Var36._M_pi)->_M_use_count = iVar1 - value2;
        (_Var36._M_pi)->_M_weak_count = iVar3 - value2;
        iVar32 = *(int *)((long)&p_Var33[1]._vptr__Sp_counted_base + 4);
        iVar1 = p_Var33[1]._M_use_count;
        iVar3 = p_Var33[1]._M_weak_count;
        *(int *)&_Var36._M_pi[1]._vptr__Sp_counted_base =
             *(int *)&p_Var33[1]._vptr__Sp_counted_base - value2;
        *(int *)((long)&_Var36._M_pi[1]._vptr__Sp_counted_base + 4) = iVar32 - value2;
        _Var36._M_pi[1]._M_use_count = iVar1 - value2;
        _Var36._M_pi[1]._M_weak_count = iVar3 - value2;
        iVar32 = *(int *)((long)&p_Var33[2]._vptr__Sp_counted_base + 4);
        iVar1 = p_Var33[2]._M_use_count;
        iVar3 = p_Var33[2]._M_weak_count;
        *(int *)&_Var36._M_pi[2]._vptr__Sp_counted_base =
             *(int *)&p_Var33[2]._vptr__Sp_counted_base - value2;
        *(int *)((long)&_Var36._M_pi[2]._vptr__Sp_counted_base + 4) = iVar32 - value2;
        _Var36._M_pi[2]._M_use_count = iVar1 - value2;
        _Var36._M_pi[2]._M_weak_count = iVar3 - value2;
        iVar32 = *(int *)((long)&p_Var33[3]._vptr__Sp_counted_base + 4);
        iVar1 = p_Var33[3]._M_use_count;
        iVar3 = p_Var33[3]._M_weak_count;
        *(int *)&_Var36._M_pi[3]._vptr__Sp_counted_base =
             *(int *)&p_Var33[3]._vptr__Sp_counted_base - value2;
        *(int *)((long)&_Var36._M_pi[3]._vptr__Sp_counted_base + 4) = iVar32 - value2;
        _Var36._M_pi[3]._M_use_count = iVar1 - value2;
        _Var36._M_pi[3]._M_weak_count = iVar3 - value2;
        uVar39 = uVar41 - 4;
        p_Var33 = p_Var33 + 4;
        _Var36._M_pi = _Var36._M_pi + 4;
        bVar2 = 7 < uVar41;
        uVar41 = uVar39;
      } while (bVar2);
    }
    if (1 < (int)uVar39) {
      iVar32 = *(int *)((long)&p_Var33->_vptr__Sp_counted_base + 4);
      iVar1 = p_Var33->_M_use_count;
      iVar3 = p_Var33->_M_weak_count;
      *(int *)&(_Var36._M_pi)->_vptr__Sp_counted_base =
           *(int *)&p_Var33->_vptr__Sp_counted_base - value2;
      *(int *)((long)&(_Var36._M_pi)->_vptr__Sp_counted_base + 4) = iVar32 - value2;
      (_Var36._M_pi)->_M_use_count = iVar1 - value2;
      (_Var36._M_pi)->_M_weak_count = iVar3 - value2;
      iVar32 = *(int *)((long)&p_Var33[1]._vptr__Sp_counted_base + 4);
      iVar1 = p_Var33[1]._M_use_count;
      iVar3 = p_Var33[1]._M_weak_count;
      *(int *)&_Var36._M_pi[1]._vptr__Sp_counted_base =
           *(int *)&p_Var33[1]._vptr__Sp_counted_base - value2;
      *(int *)((long)&_Var36._M_pi[1]._vptr__Sp_counted_base + 4) = iVar32 - value2;
      _Var36._M_pi[1]._M_use_count = iVar1 - value2;
      _Var36._M_pi[1]._M_weak_count = iVar3 - value2;
      uVar39 = uVar39 - 2;
      p_Var33 = p_Var33 + 2;
      _Var36._M_pi = _Var36._M_pi + 2;
    }
    if (uVar39 != 0) {
      iVar32 = *(int *)((long)&p_Var33->_vptr__Sp_counted_base + 4);
      iVar1 = p_Var33->_M_use_count;
      iVar3 = p_Var33->_M_weak_count;
      *(int *)&(_Var36._M_pi)->_vptr__Sp_counted_base =
           *(int *)&p_Var33->_vptr__Sp_counted_base - value2;
      *(int *)((long)&(_Var36._M_pi)->_vptr__Sp_counted_base + 4) = iVar32 - value2;
      (_Var36._M_pi)->_M_use_count = iVar1 - value2;
      (_Var36._M_pi)->_M_weak_count = iVar3 - value2;
    }
  }
  if (uVar38 != length) {
    lVar34 = (long)(int)uVar38;
    do {
      uVar39 = *(int *)((long)&local_80->_vptr__Sp_counted_base + lVar34 * 4) - value2;
      p_Var33 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(ulong)uVar39;
      *(uint *)((long)&(pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                       _vptr__Sp_counted_base + lVar34 * 4) = uVar39;
      lVar34 = lVar34 + 1;
    } while (lVar34 < lVar42);
  }
  if (length != 0) {
    uVar35 = 0;
    do {
      if (*(int *)((long)&(pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                          )->_vptr__Sp_counted_base + uVar35 * 4) != value1 - value2) {
        puVar37 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar37 = "void test_arithm(unsigned int, T, T, bool) [T = int]";
        *(undefined4 *)(puVar37 + 1) = 0x4b;
        *(uint *)((long)puVar37 + 0xc) = length;
        __cxa_throw(puVar37,&Exception::typeinfo,0);
      }
      uVar35 = uVar35 + 1;
    } while (uVar31 != uVar35);
    _Var36._M_pi = pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    p_Var33 = local_80;
    uVar39 = uVar44;
    uVar41 = uVar44;
    if (3 < (int)uVar44) {
      do {
        iVar32 = *(int *)((long)&p_Var33->_vptr__Sp_counted_base + 4);
        iVar1 = p_Var33->_M_use_count;
        iVar3 = p_Var33->_M_weak_count;
        *(int *)&(_Var36._M_pi)->_vptr__Sp_counted_base =
             value2 - *(int *)&p_Var33->_vptr__Sp_counted_base;
        *(int *)((long)&(_Var36._M_pi)->_vptr__Sp_counted_base + 4) = value2 - iVar32;
        (_Var36._M_pi)->_M_use_count = value2 - iVar1;
        (_Var36._M_pi)->_M_weak_count = value2 - iVar3;
        iVar32 = *(int *)((long)&p_Var33[1]._vptr__Sp_counted_base + 4);
        iVar1 = p_Var33[1]._M_use_count;
        iVar3 = p_Var33[1]._M_weak_count;
        *(int *)&_Var36._M_pi[1]._vptr__Sp_counted_base =
             value2 - *(int *)&p_Var33[1]._vptr__Sp_counted_base;
        *(int *)((long)&_Var36._M_pi[1]._vptr__Sp_counted_base + 4) = value2 - iVar32;
        _Var36._M_pi[1]._M_use_count = value2 - iVar1;
        _Var36._M_pi[1]._M_weak_count = value2 - iVar3;
        iVar32 = *(int *)((long)&p_Var33[2]._vptr__Sp_counted_base + 4);
        iVar1 = p_Var33[2]._M_use_count;
        iVar3 = p_Var33[2]._M_weak_count;
        *(int *)&_Var36._M_pi[2]._vptr__Sp_counted_base =
             value2 - *(int *)&p_Var33[2]._vptr__Sp_counted_base;
        *(int *)((long)&_Var36._M_pi[2]._vptr__Sp_counted_base + 4) = value2 - iVar32;
        _Var36._M_pi[2]._M_use_count = value2 - iVar1;
        _Var36._M_pi[2]._M_weak_count = value2 - iVar3;
        iVar32 = *(int *)((long)&p_Var33[3]._vptr__Sp_counted_base + 4);
        iVar1 = p_Var33[3]._M_use_count;
        iVar3 = p_Var33[3]._M_weak_count;
        *(int *)&_Var36._M_pi[3]._vptr__Sp_counted_base =
             value2 - *(int *)&p_Var33[3]._vptr__Sp_counted_base;
        *(int *)((long)&_Var36._M_pi[3]._vptr__Sp_counted_base + 4) = value2 - iVar32;
        _Var36._M_pi[3]._M_use_count = value2 - iVar1;
        _Var36._M_pi[3]._M_weak_count = value2 - iVar3;
        uVar39 = uVar41 - 4;
        p_Var33 = p_Var33 + 4;
        _Var36._M_pi = _Var36._M_pi + 4;
        bVar2 = 7 < uVar41;
        uVar41 = uVar39;
      } while (bVar2);
    }
    if (1 < (int)uVar39) {
      iVar32 = *(int *)((long)&p_Var33->_vptr__Sp_counted_base + 4);
      iVar1 = p_Var33->_M_use_count;
      iVar3 = p_Var33->_M_weak_count;
      *(int *)&(_Var36._M_pi)->_vptr__Sp_counted_base =
           value2 - *(int *)&p_Var33->_vptr__Sp_counted_base;
      *(int *)((long)&(_Var36._M_pi)->_vptr__Sp_counted_base + 4) = value2 - iVar32;
      (_Var36._M_pi)->_M_use_count = value2 - iVar1;
      (_Var36._M_pi)->_M_weak_count = value2 - iVar3;
      iVar32 = *(int *)((long)&p_Var33[1]._vptr__Sp_counted_base + 4);
      iVar1 = p_Var33[1]._M_use_count;
      iVar3 = p_Var33[1]._M_weak_count;
      *(int *)&_Var36._M_pi[1]._vptr__Sp_counted_base =
           value2 - *(int *)&p_Var33[1]._vptr__Sp_counted_base;
      *(int *)((long)&_Var36._M_pi[1]._vptr__Sp_counted_base + 4) = value2 - iVar32;
      _Var36._M_pi[1]._M_use_count = value2 - iVar1;
      _Var36._M_pi[1]._M_weak_count = value2 - iVar3;
      uVar39 = uVar39 - 2;
      p_Var33 = p_Var33 + 2;
      _Var36._M_pi = _Var36._M_pi + 2;
    }
    if (uVar39 != 0) {
      iVar32 = *(int *)((long)&p_Var33->_vptr__Sp_counted_base + 4);
      iVar1 = p_Var33->_M_use_count;
      iVar3 = p_Var33->_M_weak_count;
      *(int *)&(_Var36._M_pi)->_vptr__Sp_counted_base =
           value2 - *(int *)&p_Var33->_vptr__Sp_counted_base;
      *(int *)((long)&(_Var36._M_pi)->_vptr__Sp_counted_base + 4) = value2 - iVar32;
      (_Var36._M_pi)->_M_use_count = value2 - iVar1;
      (_Var36._M_pi)->_M_weak_count = value2 - iVar3;
    }
  }
  if (uVar38 != length) {
    lVar34 = (long)(int)uVar38;
    do {
      uVar39 = value2 - *(int *)((long)&local_80->_vptr__Sp_counted_base + lVar34 * 4);
      p_Var33 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(ulong)uVar39;
      *(uint *)((long)&(pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                       _vptr__Sp_counted_base + lVar34 * 4) = uVar39;
      lVar34 = lVar34 + 1;
    } while (lVar34 < lVar42);
  }
  if (length != 0) {
    uVar35 = 0;
    do {
      if (*(int *)((long)&(pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                          )->_vptr__Sp_counted_base + uVar35 * 4) != value2 - value1) {
        puVar37 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar37 = "void test_arithm(unsigned int, T, T, bool) [T = int]";
        *(undefined4 *)(puVar37 + 1) = 0x53;
        *(uint *)((long)puVar37 + 0xc) = length;
        __cxa_throw(puVar37,&Exception::typeinfo,0);
      }
      uVar35 = uVar35 + 1;
    } while (uVar31 != uVar35);
    _Var36._M_pi = pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    p_Var33 = local_80;
    uVar39 = uVar44;
    if (3 < (int)uVar44) {
      do {
        _Var46 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)
                 pmulld((undefined1  [16])*p_Var33,(undefined1  [16])_Var45);
        *_Var36._M_pi = _Var46;
        _Var46 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)
                 pmulld((undefined1  [16])p_Var33[1],(undefined1  [16])_Var45);
        _Var36._M_pi[1] = _Var46;
        _Var46 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)
                 pmulld((undefined1  [16])p_Var33[2],(undefined1  [16])_Var45);
        _Var36._M_pi[2] = _Var46;
        _Var46 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)
                 pmulld((undefined1  [16])p_Var33[3],(undefined1  [16])_Var45);
        _Var36._M_pi[3] = _Var46;
        uVar39 = uVar44 - 4;
        p_Var33 = p_Var33 + 4;
        _Var36._M_pi = _Var36._M_pi + 4;
        bVar2 = 7 < uVar44;
        uVar44 = uVar39;
      } while (bVar2);
    }
    if (1 < (int)uVar39) {
      _Var46 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)
               pmulld((undefined1  [16])*p_Var33,(undefined1  [16])_Var45);
      *_Var36._M_pi = _Var46;
      _Var46 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)
               pmulld((undefined1  [16])p_Var33[1],(undefined1  [16])_Var45);
      _Var36._M_pi[1] = _Var46;
      uVar39 = uVar39 - 2;
      p_Var33 = p_Var33 + 2;
      _Var36._M_pi = _Var36._M_pi + 2;
    }
    if (uVar39 != 0) {
      _Var45 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)
               pmulld((undefined1  [16])_Var45,(undefined1  [16])*p_Var33);
      *_Var36._M_pi = _Var45;
    }
  }
  if (uVar38 != length) {
    lVar34 = (long)(int)uVar38;
    do {
      uVar38 = *(int *)((long)&local_80->_vptr__Sp_counted_base + lVar34 * 4) * value2;
      p_Var33 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(ulong)uVar38;
      *(uint *)((long)&(pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                       _vptr__Sp_counted_base + lVar34 * 4) = uVar38;
      lVar34 = lVar34 + 1;
    } while (lVar34 < lVar42);
  }
  if (length != 0) {
    uVar35 = 0;
    do {
      if (*(int *)((long)&(pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                          )->_vptr__Sp_counted_base + uVar35 * 4) != value2 * value1) {
        puVar37 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar37 = "void test_arithm(unsigned int, T, T, bool) [T = int]";
        *(undefined4 *)(puVar37 + 1) = 0x5b;
        *(uint *)((long)puVar37 + 0xc) = length;
        __cxa_throw(puVar37,&Exception::typeinfo,0);
      }
      uVar35 = uVar35 + 1;
    } while (uVar31 != uVar35);
  }
  if (local_80 == pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi) {
    if (0 < (int)length) {
      uVar35 = 0;
      do {
        iVar32 = *(int *)((long)&(pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount._M_pi)->_vptr__Sp_counted_base + uVar35 * 4);
        p_Var33 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  ((long)iVar32 % (long)value2 & 0xffffffff);
        *(int *)((long)&(pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
                        ->_vptr__Sp_counted_base + uVar35 * 4) = iVar32 / value2;
        uVar35 = uVar35 + 1;
      } while (uVar31 != uVar35);
    }
  }
  else if (0 < (int)length) {
    uVar35 = 0;
    do {
      iVar32 = *(int *)((long)&local_80->_vptr__Sp_counted_base + uVar35 * 4);
      p_Var33 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                ((long)iVar32 % (long)value2 & 0xffffffff);
      *(int *)((long)&(pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                      _vptr__Sp_counted_base + uVar35 * 4) = iVar32 / value2;
      uVar35 = uVar35 + 1;
    } while (uVar31 != uVar35);
  }
  if (length != 0) {
    uVar35 = 0;
    do {
      if (*(int *)((long)&(pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                          )->_vptr__Sp_counted_base + uVar35 * 4) != value1 / value2) {
        puVar37 = (undefined8 *)
                  __cxa_allocate_exception
                            (0x10,pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount._M_pi,p_Var33);
        *puVar37 = "void test_arithm(unsigned int, T, T, bool) [T = int]";
        *(undefined4 *)(puVar37 + 1) = 99;
        *(uint *)((long)puVar37 + 0xc) = length;
        __cxa_throw(puVar37,&Exception::typeinfo,0);
      }
      uVar35 = uVar35 + 1;
    } while (uVar31 != uVar35);
    uVar35 = (long)value2 % (long)value1;
    if (0 < (int)length) {
      uVar43 = 0;
      do {
        iVar32 = *(int *)((long)&local_80->_vptr__Sp_counted_base + uVar43 * 4);
        uVar35 = (long)value2 % (long)iVar32;
        *(int *)((long)&(pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
                        ->_vptr__Sp_counted_base + uVar43 * 4) = value2 / iVar32;
        uVar43 = uVar43 + 1;
      } while (uVar31 != uVar43);
    }
    p_Var33 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(uVar35 & 0xffffffff);
    if (length != 0) {
      uVar35 = 0;
      do {
        if (*(int *)((long)&(pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                            _M_pi)->_vptr__Sp_counted_base + uVar35 * 4) != value2 / value1) {
          puVar37 = (undefined8 *)
                    __cxa_allocate_exception
                              (0x10,pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_refcount._M_pi,p_Var33);
          *puVar37 = "void test_arithm(unsigned int, T, T, bool) [T = int]";
          *(undefined4 *)(puVar37 + 1) = 0x6b;
          *(uint *)((long)puVar37 + 0xc) = length;
          __cxa_throw(puVar37,&Exception::typeinfo,0);
        }
        uVar35 = uVar35 + 1;
      } while (uVar31 != uVar35);
    }
  }
  if ((presult.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_1_ == '\0')
     && (*(int *)((long)&(pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
                         ->_vptr__Sp_counted_base + uVar31 * 4) != 0x7f)) {
    puVar37 = (undefined8 *)
              __cxa_allocate_exception
                        (0x10,pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                              _M_pi,p_Var33);
    *puVar37 = "void test_arithm(unsigned int, T, T, bool) [T = int]";
    *(undefined4 *)(puVar37 + 1) = 0x70;
    *(uint *)((long)puVar37 + 0xc) = length;
    __cxa_throw(puVar37,&Exception::typeinfo,0);
  }
  if (presult.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               presult.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  if (pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  if (pv1.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               pv1.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  return;
}

Assistant:

void test_arithm(unsigned length, T value1, T value2, bool allowTrash = false)
{
    auto pv1 = std::shared_ptr<T>(simd::malloc<T>(length), simd::free<T>);
    auto pv2 = std::shared_ptr<T>(simd::malloc<T>(length), simd::free<T>);
    auto presult = std::shared_ptr<T>(simd::malloc<T>(length+1), simd::free<T>);
    T * v1 = pv1.get();
    T * v2 = pv2.get();
    T * result = presult.get();
    result[length] = 0x7f;

    simd::set(value1, v1, length);
    simd::set(value2, v2, length);

    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(v1[i], value1) || ! equal(v2[i], value2))
            FAIL();
    }

    T r = value1 + value2;
    arithm::add(v1, v2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 - value2;
    arithm::sub(v1, v2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 * value2;
    arithm::mul(v1, v2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 / value2;
    arithm::div(v1, v2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

#ifndef TEST_FIXED
    r = value1 + value2;
    simd::addC(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 - value2;
    simd::subC(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (result[i] != r)
            FAIL();
    }

    r = value2 - value1;
    simd::subCRev(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 * value2;
    simd::mulC(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (result[i] != r)
            FAIL();
    }

    r = value1 / value2;
    simd::divC(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value2 / value1;
    simd::divCRev(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }
#endif // TEST_FIXED

    if (!allowTrash && result[length] != 0x7f)
        FAIL();
}